

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksForTargets
          (cmExtraEclipseCDT4Generator *this,cmGeneratedFileStream *fout)

{
  cmGlobalGenerator *pcVar1;
  cmGeneratorTarget *this_00;
  pointer pcVar2;
  bool bVar3;
  TargetType TVar4;
  string *psVar5;
  char *pcVar6;
  cmSourceGroup *this_01;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__x;
  pointer ppcVar7;
  pointer ppcVar8;
  pointer ppcVar9;
  string source;
  string fullPath;
  string linkName2;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  string linkName;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sFiles;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  string linkName4;
  string local_180;
  pointer local_160;
  string local_158;
  string local_138;
  cmSourceGroup *local_118;
  string local_110;
  cmMakefile *local_f0;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_e8;
  string local_d0;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_b0;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_98;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> local_80;
  string local_68;
  pointer local_48;
  cmExtraEclipseCDT4Generator *local_40;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *local_38;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"[Targets]","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"virtual:/virtual","");
  AppendLinkedResource(fout,&local_d0,&local_138,VirtualFolder);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  ppcVar7 = (pcVar1->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar7 !=
      (pcVar1->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_40 = this;
    do {
      local_f0 = (*ppcVar7)->Makefile;
      local_48 = ppcVar7;
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                (&local_98,&(*ppcVar7)->GeneratorTargets);
      local_160 = local_98.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      if (local_98.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_98.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_38 = &local_f0->SourceGroups;
        do {
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_138,local_d0._M_dataplus._M_p,
                     local_d0._M_dataplus._M_p + local_d0._M_string_length);
          std::__cxx11::string::append((char *)&local_138);
          TVar4 = cmGeneratorTarget::GetType(*local_160);
          if (TVar4 < UTILITY) {
            cmGeneratorTarget::GetType(*local_160);
            std::__cxx11::string::append((char *)&local_138);
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(*local_160);
            std::__cxx11::string::_M_append((char *)&local_138,(ulong)(psVar5->_M_dataplus)._M_p);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_180,"virtual:/virtual","");
            AppendLinkedResource(fout,&local_138,&local_180,VirtualFolder);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if (this->GenerateLinkedResources != false) {
              std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector(&local_80,local_38)
              ;
              this_00 = *local_160;
              local_e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_158,"CMAKE_BUILD_TYPE","");
              pcVar6 = cmMakefile::GetSafeDefinition(local_f0,&local_158);
              std::__cxx11::string::string((string *)&local_180,pcVar6,(allocator *)&local_68);
              cmGeneratorTarget::GetSourceFiles(this_00,&local_e8,&local_180);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              ppcVar9 = local_e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
                ppcVar9 = local_e8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              }
              for (; ppcVar9 !=
                     local_e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish; ppcVar9 = ppcVar9 + 1) {
                psVar5 = cmSourceFile::GetFullPath(*ppcVar9,(string *)0x0);
                local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
                pcVar2 = (psVar5->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_180,pcVar2,pcVar2 + psVar5->_M_string_length);
                this_01 = cmMakefile::FindSourceGroup(local_f0,local_180._M_dataplus._M_p,&local_80)
                ;
                cmSourceGroup::AssignSource(this_01,*ppcVar9);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._M_dataplus._M_p != &local_180.field_2) {
                  operator_delete(local_180._M_dataplus._M_p,
                                  local_180.field_2._M_allocated_capacity + 1);
                }
              }
              local_118 = local_80.super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              if (local_80.super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                  .super__Vector_impl_data._M_start !=
                  local_80.super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                  .super__Vector_impl_data._M_finish) {
                do {
                  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_180,local_138._M_dataplus._M_p,
                             local_138._M_dataplus._M_p + local_138._M_string_length);
                  std::__cxx11::string::append((char *)&local_180);
                  cmSourceGroup::GetFullName(local_118);
                  std::__cxx11::string::append((char *)&local_180);
                  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_158,"virtual:/virtual","");
                  AppendLinkedResource(fout,&local_180,&local_158,VirtualFolder);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158._M_dataplus._M_p != &local_158.field_2) {
                    operator_delete(local_158._M_dataplus._M_p,
                                    local_158.field_2._M_allocated_capacity + 1);
                  }
                  __x = cmSourceGroup::GetSourceFiles(local_118);
                  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                            (&local_b0,__x);
                  ppcVar8 = local_b0.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (local_b0.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      local_b0.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    do {
                      psVar5 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar8);
                      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                      pcVar2 = (psVar5->_M_dataplus)._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_158,pcVar2,pcVar2 + psVar5->_M_string_length);
                      bVar3 = cmsys::SystemTools::FileIsDirectory(&local_158);
                      if (!bVar3) {
                        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_68,local_180._M_dataplus._M_p,
                                   local_180._M_dataplus._M_p + local_180._M_string_length);
                        std::__cxx11::string::append((char *)&local_68);
                        cmsys::SystemTools::GetFilenameName(&local_110,&local_158);
                        std::__cxx11::string::_M_append
                                  ((char *)&local_68,(ulong)local_110._M_dataplus._M_p);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_110._M_dataplus._M_p != &local_110.field_2) {
                          operator_delete(local_110._M_dataplus._M_p,
                                          local_110.field_2._M_allocated_capacity + 1);
                        }
                        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_110,local_158._M_dataplus._M_p,
                                   local_158._M_dataplus._M_p + local_158._M_string_length);
                        AppendLinkedResource(fout,&local_68,&local_110,LinkToFile);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_110._M_dataplus._M_p != &local_110.field_2) {
                          operator_delete(local_110._M_dataplus._M_p,
                                          local_110.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_68._M_dataplus._M_p != &local_68.field_2) {
                          operator_delete(local_68._M_dataplus._M_p,
                                          local_68.field_2._M_allocated_capacity + 1);
                        }
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_158._M_dataplus._M_p != &local_158.field_2) {
                        operator_delete(local_158._M_dataplus._M_p,
                                        local_158.field_2._M_allocated_capacity + 1);
                      }
                      ppcVar8 = ppcVar8 + 1;
                    } while (ppcVar8 !=
                             local_b0.
                             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  if (local_b0.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_b0.
                                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_b0.
                                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_b0.
                                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_180._M_dataplus._M_p != &local_180.field_2) {
                    operator_delete(local_180._M_dataplus._M_p,
                                    local_180.field_2._M_allocated_capacity + 1);
                  }
                  local_118 = local_118 + 1;
                } while (local_118 !=
                         local_80.super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
              }
              if (local_e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_e8.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_e8.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_e8.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&local_80);
              this = local_40;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          local_160 = local_160 + 1;
        } while (local_160 !=
                 local_98.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_98.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      ppcVar7 = local_48 + 1;
    } while (ppcVar7 !=
             (((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksForTargets(
                                                   cmGeneratedFileStream& fout)
{
  std::string linkName = "[Targets]";
  this->AppendLinkedResource(fout, linkName, "virtual:/virtual",VirtualFolder);

  for (std::vector<cmLocalGenerator*>::const_iterator
       lgIt = this->GlobalGenerator->GetLocalGenerators().begin();
       lgIt != this->GlobalGenerator->GetLocalGenerators().end();
       ++lgIt)
    {
    cmMakefile* makefile = (*lgIt)->GetMakefile();
    const std::vector<cmGeneratorTarget*> targets =
        (*lgIt)->GetGeneratorTargets();

    for(std::vector<cmGeneratorTarget*>::const_iterator ti=targets.begin();
        ti!=targets.end();++ti)
      {
      std::string linkName2 = linkName;
      linkName2 += "/";
      switch((*ti)->GetType())
        {
        case cmState::EXECUTABLE:
        case cmState::STATIC_LIBRARY:
        case cmState::SHARED_LIBRARY:
        case cmState::MODULE_LIBRARY:
        case cmState::OBJECT_LIBRARY:
          {
          const char* prefix = ((*ti)->GetType()==cmState::EXECUTABLE ?
                                                          "[exe] " : "[lib] ");
          linkName2 += prefix;
          linkName2 += (*ti)->GetName();
          this->AppendLinkedResource(fout, linkName2, "virtual:/virtual",
                                     VirtualFolder);
          if (!this->GenerateLinkedResources)
            {
            break; // skip generating the linked resources to the source files
            }
          std::vector<cmSourceGroup> sourceGroups=makefile->GetSourceGroups();
          // get the files from the source lists then add them to the groups
          cmGeneratorTarget* gt = const_cast<cmGeneratorTarget*>(*ti);
          std::vector<cmSourceFile*> files;
          gt->GetSourceFiles(files,
                            makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for(std::vector<cmSourceFile*>::const_iterator sfIt = files.begin();
              sfIt != files.end();
              sfIt++)
            {
            // Add the file to the list of sources.
            std::string source = (*sfIt)->GetFullPath();
            cmSourceGroup* sourceGroup =
                       makefile->FindSourceGroup(source.c_str(), sourceGroups);
            sourceGroup->AssignSource(*sfIt);
            }

          for(std::vector<cmSourceGroup>::iterator sgIt = sourceGroups.begin();
              sgIt != sourceGroups.end();
              ++sgIt)
            {
            std::string linkName3 = linkName2;
            linkName3 += "/";
            linkName3 += sgIt->GetFullName();
            this->AppendLinkedResource(fout, linkName3, "virtual:/virtual",
                                       VirtualFolder);

            std::vector<const cmSourceFile*> sFiles = sgIt->GetSourceFiles();
            for(std::vector<const cmSourceFile*>::const_iterator fileIt =
                                                                sFiles.begin();
                fileIt != sFiles.end();
                ++fileIt)
              {
              std::string fullPath = (*fileIt)->GetFullPath();
              if (!cmSystemTools::FileIsDirectory(fullPath))
                {
                std::string linkName4 = linkName3;
                linkName4 += "/";
                linkName4 += cmSystemTools::GetFilenameName(fullPath);
                this->AppendLinkedResource(fout, linkName4,
                                           this->GetEclipsePath(fullPath),
                                           LinkToFile);
                }
              }
            }
          }
          break;
        // ignore all others:
        default:
          break;
        }
      }
    }
}